

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  Int32 IVar2;
  ostream *poVar3;
  Int32 result;
  string env_var;
  undefined4 in_stack_ffffffffffffff90;
  Int32 in_stack_ffffffffffffff94;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60;
  char *local_40 [4];
  
  FlagToEnvVar_abi_cxx11_((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  str = getenv(local_40[0]);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    Message::Message((Message *)&local_60);
    poVar3 = (ostream *)(local_60._M_dataplus._M_p + 0x10);
    std::operator<<(poVar3,"Environment variable ");
    std::operator<<(poVar3,(string *)local_40);
    bVar1 = ParseInt32((Message *)&local_60,str,(Int32 *)&stack0xffffffffffffff94);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
    if (!bVar1) {
      Message::Message((Message *)&local_68);
      std::ostream::operator<<(local_68.ptr_ + 0x10,default_value);
      StringStreamToString(&local_60,local_68.ptr_);
      printf("The default value %s is used.\n",local_60._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_60);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
      fflush(_stdout);
      IVar2 = default_value;
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}